

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfZip.cpp
# Opt level: O3

void Imf_3_4::Zip::initializeFuncs(void)

{
  CpuId cpuId;
  CpuId local_f;
  
  CpuId::CpuId(&local_f);
  if (local_f.sse2 == true) {
    (anonymous_namespace)::interleave = anon_unknown_0::interleave_sse2;
  }
  return;
}

Assistant:

void
Zip::initializeFuncs ()
{
    CpuId cpuId;

#ifdef IMF_HAVE_SSE4_1
    if (cpuId.sse4_1) { reconstruct = reconstruct_sse41; }
#endif

#ifdef IMF_HAVE_SSE2
    if (cpuId.sse2) { interleave = interleave_sse2; }
#endif

#ifdef IMF_HAVE_NEON_AARCH64
    reconstruct = reconstruct_neon;
    interleave  = interleave_neon;
#endif
}